

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COBLoader.cpp
# Opt level: O0

void __thiscall chunk_guard::~chunk_guard(chunk_guard *this)

{
  uint uVar1;
  StreamReader<false,_false> *this_00;
  int iVar2;
  DeadlyImportError *anon_var_0;
  chunk_guard *this_local;
  
  if (this->nfo->size != 0xffffffff) {
    this_00 = this->reader;
    uVar1 = this->nfo->size;
    iVar2 = Assimp::StreamReader<false,_false>::GetCurrentPos(this_00);
    Assimp::StreamReader<false,_false>::IncPtr(this_00,(long)(int)(uVar1 - iVar2) + this->cur);
  }
  return;
}

Assistant:

~chunk_guard() {
        // don't do anything if the size is not given
        if(nfo.size != static_cast<unsigned int>(-1)) {
            try {
                reader.IncPtr( static_cast< int >( nfo.size ) - reader.GetCurrentPos() + cur );
            } catch (const DeadlyImportError& ) {
                // out of limit so correct the value
                reader.IncPtr( reader.GetReadLimit() );
            }
        }
    }